

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O3

void __thiscall OpenMD::EAM::calcDensity(EAM *this,InteractionData *idat)

{
  double dVar1;
  pointer piVar2;
  pointer pEVar3;
  pointer pEVar4;
  RealType RVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar2 = (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar4 = (this->EAMdata).
           super__Vector_base<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar7 = idat->rij;
  if ((this->haveCutoffRadius_ == true) && (this->eamRcut_ <= dVar7 && dVar7 != this->eamRcut_)) {
    return;
  }
  pEVar3 = pEVar4 + piVar2[idat->atid1];
  pEVar4 = pEVar4 + piVar2[idat->atid2];
  if (dVar7 < pEVar3->rcut) {
    if (pEVar3->isFluctuatingCharge == true) {
      if (this->mixMeth_ == eamDream2) {
        dVar1 = idat->flucQ1;
        dVar6 = pEVar3->nValence;
        dVar8 = pEVar3->nMobile;
        dVar7 = 0.0;
        if (dVar1 < dVar6) {
          if (dVar1 <= -dVar8) {
            dVar8 = dVar6 + dVar8;
            goto LAB_0022c86d;
          }
          dVar7 = ((dVar8 + dVar1 + dVar6) * (dVar1 - dVar6) * (dVar1 - dVar6)) /
                  ((dVar6 + dVar8) * dVar6 * dVar6);
        }
      }
      else {
        dVar6 = pEVar3->nValence;
        dVar8 = dVar6 - idat->flucQ1;
LAB_0022c86d:
        dVar7 = dVar8 / dVar6;
      }
    }
    else {
      dVar7 = 1.0;
    }
    RVar5 = CubicSpline::getValueAt
                      ((pEVar3->rho).
                       super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       &idat->rij);
    idat->rho2 = RVar5 * dVar7 + idat->rho2;
    dVar7 = idat->rij;
  }
  if (pEVar4->rcut <= dVar7) {
    return;
  }
  if (pEVar4->isFluctuatingCharge != true) {
    dVar7 = 1.0;
    goto LAB_0022c948;
  }
  if (this->mixMeth_ == eamDream2) {
    dVar1 = idat->flucQ2;
    dVar6 = pEVar4->nValence;
    dVar8 = pEVar4->nMobile;
    dVar7 = 0.0;
    if (dVar6 <= dVar1) goto LAB_0022c948;
    if (-dVar8 < dVar1) {
      dVar7 = ((dVar8 + dVar1 + dVar6) * (dVar1 - dVar6) * (dVar1 - dVar6)) /
              ((dVar6 + dVar8) * dVar6 * dVar6);
      goto LAB_0022c948;
    }
    dVar8 = dVar6 + dVar8;
  }
  else {
    dVar6 = pEVar4->nValence;
    dVar8 = dVar6 - idat->flucQ2;
  }
  dVar7 = dVar8 / dVar6;
LAB_0022c948:
  RVar5 = CubicSpline::getValueAt
                    ((pEVar4->rho).
                     super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     &idat->rij);
  idat->rho1 = RVar5 * dVar7 + idat->rho1;
  return;
}

Assistant:

void EAM::calcDensity(InteractionData& idat) {
    if (!initialized_) initialize();

    EAMAtomData& data1 = EAMdata[EAMtids[idat.atid1]];
    EAMAtomData& data2 = EAMdata[EAMtids[idat.atid2]];
    RealType s;

    if (haveCutoffRadius_)
      if (idat.rij > eamRcut_) return;

    if (idat.rij < data1.rcut) {
      s = 1.0;
      if (data1.isFluctuatingCharge) {
        if (mixMeth_ == eamDream2)
          s = gFunc(idat.flucQ1, data1.nValence, data1.nMobile);
        else
          s = (data1.nValence - idat.flucQ1) / (data1.nValence);
      }
      idat.rho2 += s * data1.rho->getValueAt(idat.rij);
    }

    if (idat.rij < data2.rcut) {
      s = 1.0;
      if (data2.isFluctuatingCharge) {
        if (mixMeth_ == eamDream2)
          s = gFunc(idat.flucQ2, data2.nValence, data2.nMobile);
        else
          s = (data2.nValence - idat.flucQ2) / (data2.nValence);
      }
      idat.rho1 += s * data2.rho->getValueAt(idat.rij);
    }

    return;
  }